

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::RuntimeError::RuntimeError(RuntimeError *this,String *msg)

{
  String local_38;
  String *local_18;
  String *msg_local;
  RuntimeError *this_local;
  
  local_18 = msg;
  msg_local = (String *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)msg);
  Exception::Exception(&this->super_Exception,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__RuntimeError_0156d998;
  return;
}

Assistant:

RuntimeError::RuntimeError(String const& msg) : Exception(msg) {}